

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

void __thiscall
FileReaderLZMA::FileReaderLZMA
          (FileReaderLZMA *this,FileReader *file,size_t uncompressed_size,bool zip)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  StreamPointer *pSVar3;
  ISzAlloc *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int err;
  BYTE header [9];
  bool zip_local;
  size_t uncompressed_size_local;
  FileReader *file_local;
  FileReaderLZMA *this_local;
  
  FileReaderBase::FileReaderBase(&this->super_FileReaderBase);
  (this->super_FileReaderBase)._vptr_FileReaderBase = (_func_int **)&PTR__FileReaderLZMA_009f4ce0;
  this->File = file;
  this->SawEOF = false;
  if (zip) {
    this->Size = uncompressed_size;
    this->OutProcessed = 0;
    iVar1 = (*(this->File->super_FileReaderBase)._vptr_FileReaderBase[2])
                      (this->File,&stack0xffffffffffffffd6,9);
    if (CONCAT44(extraout_var,iVar1) < 9) {
      I_Error("FileReaderLZMA: File too shart\n");
    }
    if ((uint)(byte)err + (uint)err._1_1_ * 0x100 != 5) {
      I_Error("FileReaderLZMA: LZMA props size is %d (expected %d)\n",
              (ulong)CONCAT11(err._1_1_,(byte)err),5);
    }
    FillBuffer(this);
    pSVar3 = (StreamPointer *)operator_new(0x88);
    this->Streamp = pSVar3;
    (this->Streamp->Stream).dic = (Byte *)0x0;
    (this->Streamp->Stream).probs = (UInt16 *)0x0;
    uVar2 = LzmaDec_Allocate((CLzmaDec *)
                             CONCAT17(zip,CONCAT52(stack0xffffffffffffffda,
                                                   CONCAT11(err._1_1_,(byte)err))),
                             (Byte *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
    if (uVar2 != 0) {
      I_Error("FileReaderLZMA: LzmaDec_Allocate failed: %d\n",(ulong)uVar2);
    }
    LzmaDec_Init((CLzmaDec *)0x499322);
    return;
  }
  __assert_fail("zip == true",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/files.cpp"
                ,0x18e,"FileReaderLZMA::FileReaderLZMA(FileReader &, size_t, bool)");
}

Assistant:

FileReaderLZMA::FileReaderLZMA (FileReader &file, size_t uncompressed_size, bool zip)
: File(file), SawEOF(false)
{
	BYTE header[4 + LZMA_PROPS_SIZE];
	int err;

	assert(zip == true);

	Size = uncompressed_size;
	OutProcessed = 0;

	// Read zip LZMA properties header
	if (File.Read(header, sizeof(header)) < (long)sizeof(header))
	{
		I_Error("FileReaderLZMA: File too shart\n");
	}
	if (header[2] + header[3] * 256 != LZMA_PROPS_SIZE)
	{
		I_Error("FileReaderLZMA: LZMA props size is %d (expected %d)\n",
			header[2] + header[3] * 256, LZMA_PROPS_SIZE);
	}

	FillBuffer();

	Streamp = new StreamPointer;
	LzmaDec_Construct(&Streamp->Stream);
	err = LzmaDec_Allocate(&Streamp->Stream, header + 4, LZMA_PROPS_SIZE, &g_Alloc);

	if (err != SZ_OK)
	{
		I_Error("FileReaderLZMA: LzmaDec_Allocate failed: %d\n", err);
	}

	LzmaDec_Init(&Streamp->Stream);
}